

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O2

ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>_>
* getReadWriteFile(ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>_>
                   *__return_storage_ptr__,Twine *Filename,uint64_t FileSize,uint64_t MapSize,
                  uint64_t Offset)

{
  long *plVar1;
  uint64_t uVar2;
  uint64_t offset;
  char *pcVar3;
  error_category *peVar4;
  ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,std::default_delete<llvm::WriteThroughMemoryBuffer>>>
  *pEVar5;
  error_code eVar6;
  error_code EC_00;
  ulong uStack_b0;
  int FD;
  int local_9c;
  ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,std::default_delete<llvm::WriteThroughMemoryBuffer>>>
  *local_98;
  error_code EC;
  NamedBufferAlloc local_80;
  file_status Status;
  
  eVar6 = llvm::sys::fs::openFileForReadWrite(Filename,&FD,CD_OpenExisting,F_None,0x1b6);
  EC._M_cat = eVar6._M_cat;
  EC._M_value = eVar6._M_value;
  if (EC._M_value != 0) {
LAB_00149560:
    peVar4 = eVar6._M_cat;
    uStack_b0 = (ulong)(uint)eVar6._M_value;
LAB_00149565:
    EC_00._M_cat = peVar4;
    EC_00._0_8_ = uStack_b0;
    llvm::
    ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>_>
    ::ErrorOr(__return_storage_ptr__,EC_00);
    return __return_storage_ptr__;
  }
  if ((MapSize == 0xffffffffffffffff) && (MapSize = FileSize, FileSize == 0xffffffffffffffff)) {
    Status.super_basic_file_status.fs_st_size._0_4_ = 0;
    Status.super_basic_file_status.fs_st_size._4_4_ = 0;
    Status.super_basic_file_status.Type = status_error;
    Status.super_basic_file_status.fs_st_atime_nsec = 0;
    Status.super_basic_file_status.fs_st_mtime_nsec = 0;
    Status.super_basic_file_status.fs_st_uid = 0;
    Status.super_basic_file_status.fs_st_gid = 0;
    Status.super_basic_file_status.fs_st_atime = 0;
    Status.super_basic_file_status.fs_st_mtime = 0;
    Status.super_basic_file_status.Perms = perms_not_known;
    Status.fs_st_dev = 0;
    Status.fs_st_nlinks = 0;
    Status.fs_st_ino = 0;
    eVar6 = llvm::sys::fs::status(FD,&Status);
    if (eVar6._M_value != 0) goto LAB_00149560;
    if ((Status.super_basic_file_status.Type != block_file) &&
       (Status.super_basic_file_status.Type != regular_file)) {
      peVar4 = (error_category *)std::_V2::generic_category();
      uStack_b0 = 0x16;
      goto LAB_00149565;
    }
    MapSize = CONCAT44(Status.super_basic_file_status.fs_st_size._4_4_,
                       (undefined4)Status.super_basic_file_status.fs_st_size);
    if ((Status.super_basic_file_status.Type != regular_file) &&
       (Status.super_basic_file_status.Type != block_file)) {
      return __return_storage_ptr__;
    }
  }
  local_98 = (ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,std::default_delete<llvm::WriteThroughMemoryBuffer>>>
              *)__return_storage_ptr__;
  local_80.Name = Filename;
  plVar1 = (long *)operator_new(0x30,&local_80);
  local_9c = FD;
  *plVar1 = (long)&PTR__MemoryBufferMMapFile_001c2f88;
  uVar2 = anon_unknown.dwarf_146309::MemoryBufferMMapFile<llvm::WriteThroughMemoryBuffer>::
          getLegalMapOffset(Offset);
  offset = anon_unknown.dwarf_146309::MemoryBufferMMapFile<llvm::WriteThroughMemoryBuffer>::
           getLegalMapOffset(Offset);
  llvm::sys::fs::mapped_file_region::mapped_file_region
            ((mapped_file_region *)(plVar1 + 3),local_9c,readwrite,(MapSize + Offset) - uVar2,offset
             ,&EC);
  if (EC._M_value == 0) {
    pcVar3 = llvm::sys::fs::mapped_file_region::const_data((mapped_file_region *)(plVar1 + 3));
    uVar2 = anon_unknown.dwarf_146309::MemoryBufferMMapFile<llvm::WriteThroughMemoryBuffer>::
            getLegalMapOffset(Offset);
    pEVar5 = local_98;
    plVar1[1] = (long)(pcVar3 + (Offset - uVar2));
    plVar1[2] = (long)(pcVar3 + (Offset - uVar2) + MapSize);
    if (EC._M_value == 0) {
      Status.super_basic_file_status.fs_st_atime = (time_t)plVar1;
      llvm::
      ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,std::default_delete<llvm::WriteThroughMemoryBuffer>>>
      ::
      ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,std::default_delete<llvm::WriteThroughMemoryBuffer>>>
                (local_98,(unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>
                           *)&Status,(type *)0x0);
      plVar1 = (long *)Status.super_basic_file_status.fs_st_atime;
      if (Status.super_basic_file_status.fs_st_atime == 0) {
        return (ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>_>
                *)pEVar5;
      }
      goto LAB_00149644;
    }
  }
  pEVar5 = local_98;
  eVar6._4_4_ = 0;
  eVar6._M_value = EC._M_value;
  eVar6._M_cat = EC._M_cat;
  Status.super_basic_file_status.fs_st_atime = (time_t)plVar1;
  llvm::
  ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>_>
  ::ErrorOr((ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>_>
             *)local_98,eVar6);
LAB_00149644:
  (**(code **)(*plVar1 + 8))(plVar1);
  return (ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>_>
          *)pEVar5;
}

Assistant:

static ErrorOr<std::unique_ptr<WriteThroughMemoryBuffer>>
getReadWriteFile(const Twine &Filename, uint64_t FileSize, uint64_t MapSize,
                 uint64_t Offset) {
  int FD;
  std::error_code EC = sys::fs::openFileForReadWrite(
      Filename, FD, sys::fs::CD_OpenExisting, sys::fs::OF_None);

  if (EC)
    return EC;

  // Default is to map the full file.
  if (MapSize == uint64_t(-1)) {
    // If we don't know the file size, use fstat to find out.  fstat on an open
    // file descriptor is cheaper than stat on a random path.
    if (FileSize == uint64_t(-1)) {
      sys::fs::file_status Status;
      std::error_code EC = sys::fs::status(FD, Status);
      if (EC)
        return EC;

      // If this not a file or a block device (e.g. it's a named pipe
      // or character device), we can't mmap it, so error out.
      sys::fs::file_type Type = Status.type();
      if (Type != sys::fs::file_type::regular_file &&
          Type != sys::fs::file_type::block_file)
        return make_error_code(errc::invalid_argument);

      FileSize = Status.getSize();
    }
    MapSize = FileSize;
  }

  std::unique_ptr<WriteThroughMemoryBuffer> Result(
      new (NamedBufferAlloc(Filename))
          MemoryBufferMMapFile<WriteThroughMemoryBuffer>(false, FD, MapSize,
                                                         Offset, EC));
  if (EC)
    return EC;
  return std::move(Result);
}